

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandAbc9QVar(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  Gia_Man_t *pGVar3;
  char *pcVar4;
  uint fOrAll;
  uint fAndAll;
  char *pcVar5;
  int iVar6;
  uint local_40;
  
  fAndAll = 0;
  Extra_UtilGetoptReset();
  local_40 = 0xffffffff;
  fOrAll = 0;
  bVar1 = false;
  while( true ) {
    while( true ) {
      while( true ) {
        while (iVar2 = Extra_UtilGetopt(argc,argv,"Puevh"), iVar6 = globalUtilOptind, iVar2 == 0x76)
        {
          bVar1 = (bool)(bVar1 ^ 1);
        }
        if (iVar2 == -1) {
          pGVar3 = pAbc->pGia;
          if (pGVar3 == (Gia_Man_t *)0x0) {
            pcVar4 = "There is no current GIA.\n";
          }
          else if (pGVar3->nRegs == 0) {
            if ((0 < (int)local_40) && ((int)local_40 < pGVar3->vCis->nSize)) {
              pGVar3 = Gia_QbfQuantifyAll(pGVar3,local_40,fAndAll,fOrAll);
              Abc_FrameUpdateGia(pAbc,pGVar3);
              return 0;
            }
            pcVar4 = "The number of parameter variables is invalid (should be > 0 and < PI num).\n";
          }
          else {
            pcVar4 = "Works only for combinational networks.\n";
          }
          iVar6 = -1;
          goto LAB_0025b071;
        }
        if (iVar2 != 0x75) break;
        fAndAll = fAndAll ^ 1;
      }
      if (iVar2 != 0x65) break;
      fOrAll = fOrAll ^ 1;
    }
    if (iVar2 != 0x50) goto LAB_0025afcf;
    if (argc <= globalUtilOptind) break;
    local_40 = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar6 + 1;
    if ((int)local_40 < 0) {
LAB_0025afcf:
      iVar6 = -2;
      Abc_Print(-2,"usage: &qvar [-P num] [-uevh]\n");
      Abc_Print(-2,"\t         derives cofactors w.r.t. the last NumPi-<num> variables\n");
      Abc_Print(-2,"\t-P num : number of parameters p (should be the first PIs) [default = %d]\n",
                (ulong)local_40);
      pcVar5 = "yes";
      pcVar4 = "yes";
      if (fAndAll == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-u     : toggle ANDing cofactors (universal quantification) [default = %s]\n",
                pcVar4);
      pcVar4 = "yes";
      if (fOrAll == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-e     : toggle ORing cofactors (existential quantification) [default = %s]\n"
                ,pcVar4);
      if (!bVar1) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle verbose output [default = %s]\n",pcVar5);
      pcVar4 = "\t-h     : print the command usage\n";
LAB_0025b071:
      Abc_Print(iVar6,pcVar4);
      return 1;
    }
  }
  Abc_Print(-1,"Command line switch \"-P\" should be followed by an integer.\n");
  goto LAB_0025afcf;
}

Assistant:

int Abc_CommandAbc9QVar( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern Gia_Man_t * Gia_QbfQuantifyAll( Gia_Man_t * p, int nPars, int fAndAll, int fOrAll );
    Gia_Man_t * pTemp;
    int c, nPars   = -1;
    int fQuantU    =  0;
    int fQuantE    =  0;
    int fVerbose   =  0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Puevh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'P':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-P\" should be followed by an integer.\n" );
                goto usage;
            }
            nPars = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nPars < 0 )
                goto usage;
            break;
        case 'u':
            fQuantU ^= 1;
            break;
        case 'e':
            fQuantE ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "There is no current GIA.\n" );
        return 1;
    }
    if ( Gia_ManRegNum(pAbc->pGia) )
    {
        Abc_Print( -1, "Works only for combinational networks.\n" );
        return 1;
    }
    if ( !(nPars > 0 && nPars < Gia_ManPiNum(pAbc->pGia)) )
    {
        Abc_Print( -1, "The number of parameter variables is invalid (should be > 0 and < PI num).\n" );
        return 1;
    }
    pTemp = Gia_QbfQuantifyAll( pAbc->pGia, nPars, fQuantU, fQuantE );
    Abc_FrameUpdateGia( pAbc, pTemp );
    return 0;

usage:
    Abc_Print( -2, "usage: &qvar [-P num] [-uevh]\n" );
    Abc_Print( -2, "\t         derives cofactors w.r.t. the last NumPi-<num> variables\n" );
    Abc_Print( -2, "\t-P num : number of parameters p (should be the first PIs) [default = %d]\n", nPars );
    Abc_Print( -2, "\t-u     : toggle ANDing cofactors (universal quantification) [default = %s]\n", fQuantU? "yes": "no" );
    Abc_Print( -2, "\t-e     : toggle ORing cofactors (existential quantification) [default = %s]\n", fQuantE? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle verbose output [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}